

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConvexHullHelpers.cpp
# Opt level: O2

bool __thiscall
iDynTree::ConvexHullProjectionConstraint::buildConvexHull
          (ConvexHullProjectionConstraint *this,Direction *xAxisOfPlaneInWorld,
          Direction *yAxisOfPlaneInWorld,Position *originOfPlaneInWorld,
          vector<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_>
          *supportPolygonsExpressedInSupportFrame,
          vector<iDynTree::Transform,_std::allocator<iDynTree::Transform>_>
          *absoluteFrame_X_supportFrame)

{
  Polygon2D *this_00;
  double *pdVar1;
  double *pdVar2;
  VectorFixSize<2U> *pVVar3;
  double dVar4;
  pointer pPVar5;
  pointer pVVar6;
  int iVar7;
  int i;
  uint uVar8;
  pointer pPVar9;
  ulong uVar10;
  pointer pVVar11;
  size_t vertex;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  double *pdVar17;
  __normal_iterator<iDynTree::VectorFixSize<2U>_*,_std::vector<iDynTree::VectorFixSize<2U>,_std::allocator<iDynTree::VectorFixSize<2U>_>_>_>
  __i;
  pointer pVVar18;
  long lVar19;
  ulong uVar20;
  vector<iDynTree::VectorFixSize<2U>,_std::allocator<iDynTree::VectorFixSize<2U>_>_> projectedPoints
  ;
  vector<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_>
  supportPolygonsExpressedInAbsoluteFrame;
  Vector2 newProjectedPoint;
  Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_70;
  Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_50;
  
  iDynTree::Position::operator=(&this->o,originOfPlaneInWorld);
  newProjectedPoint.m_data[0] = (double)&this->P;
  local_70.
  super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>.
  super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (PointerType)xAxisOfPlaneInWorld;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Map<Eigen::Matrix<double,2,3,1,2,3>,0,Eigen::Stride<0,0>>,1,3,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            ((Block<Eigen::Map<Eigen::Matrix<double,_2,_3,_1,_2,_3>,_0,_Eigen::Stride<0,_0>_>,_1,_3,_false>
              *)&newProjectedPoint,
             (Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)&local_70);
  newProjectedPoint.m_data[0] = (double)&this->field_0x80;
  local_70.
  super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>.
  super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (PointerType)yAxisOfPlaneInWorld;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Map<Eigen::Matrix<double,2,3,1,2,3>,0,Eigen::Stride<0,0>>,1,3,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            ((Block<Eigen::Map<Eigen::Matrix<double,_2,_3,_1,_2,_3>,_0,_Eigen::Stride<0,_0>_>,_1,_3,_false>
              *)&newProjectedPoint,
             (Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)&local_70);
  supportPolygonsExpressedInAbsoluteFrame.
  super__Vector_base<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  supportPolygonsExpressedInAbsoluteFrame.
  super__Vector_base<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  supportPolygonsExpressedInAbsoluteFrame.
  super__Vector_base<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_>::resize
            (&supportPolygonsExpressedInAbsoluteFrame,
             ((long)(supportPolygonsExpressedInSupportFrame->
                    super__Vector_base<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_>).
                    _M_impl.super__Vector_impl_data._M_finish -
             (long)(supportPolygonsExpressedInSupportFrame->
                   super__Vector_base<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_>).
                   _M_impl.super__Vector_impl_data._M_start) / 0x18);
  lVar13 = 0;
  lVar19 = 0;
  for (uVar20 = 0;
      pPVar9 = (supportPolygonsExpressedInSupportFrame->
               super__Vector_base<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_>)._M_impl.
               super__Vector_impl_data._M_start,
      uVar20 < (ulong)(((long)(supportPolygonsExpressedInSupportFrame->
                              super__Vector_base<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)pPVar9) / 0x18);
      uVar20 = uVar20 + 1) {
    Polygon::applyTransform
              ((Polygon *)&newProjectedPoint,
               (Polygon *)
               ((long)&(pPVar9->m_vertices).
                       super__Vector_base<iDynTree::Position,_std::allocator<iDynTree::Position>_>.
                       _M_impl + lVar19),
               (Transform *)(*(long *)absoluteFrame_X_supportFrame + lVar13));
    std::vector<iDynTree::Position,_std::allocator<iDynTree::Position>_>::_M_move_assign
              ((vector<iDynTree::Position,_std::allocator<iDynTree::Position>_> *)
               ((long)&((supportPolygonsExpressedInAbsoluteFrame.
                         super__Vector_base<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_>.
                         _M_impl.super__Vector_impl_data._M_start)->m_vertices).
                       super__Vector_base<iDynTree::Position,_std::allocator<iDynTree::Position>_>.
                       _M_impl.super__Vector_impl_data._M_start + lVar19),
               (_Vector_base<iDynTree::Position,_std::allocator<iDynTree::Position>_> *)
               &newProjectedPoint);
    std::_Vector_base<iDynTree::Position,_std::allocator<iDynTree::Position>_>::~_Vector_base
              ((_Vector_base<iDynTree::Position,_std::allocator<iDynTree::Position>_> *)
               &newProjectedPoint);
    lVar19 = lVar19 + 0x18;
    lVar13 = lVar13 + 0x60;
  }
  projectedPoints.
  super__Vector_base<iDynTree::VectorFixSize<2U>,_std::allocator<iDynTree::VectorFixSize<2U>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  projectedPoints.
  super__Vector_base<iDynTree::VectorFixSize<2U>,_std::allocator<iDynTree::VectorFixSize<2U>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  projectedPoints.
  super__Vector_base<iDynTree::VectorFixSize<2U>,_std::allocator<iDynTree::VectorFixSize<2U>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pPVar9 = supportPolygonsExpressedInAbsoluteFrame.
           super__Vector_base<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (uVar20 = 0;
      pVVar11 = projectedPoints.
                super__Vector_base<iDynTree::VectorFixSize<2U>,_std::allocator<iDynTree::VectorFixSize<2U>_>_>
                ._M_impl.super__Vector_impl_data._M_finish,
      pVVar6 = projectedPoints.
               super__Vector_base<iDynTree::VectorFixSize<2U>,_std::allocator<iDynTree::VectorFixSize<2U>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
      uVar20 < (ulong)(((long)supportPolygonsExpressedInAbsoluteFrame.
                              super__Vector_base<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar9) / 0x18);
      uVar20 = uVar20 + 1) {
    lVar13 = 0;
    for (uVar12 = 0;
        pPVar5 = pPVar9[uVar20].m_vertices.
                 super__Vector_base<iDynTree::Position,_std::allocator<iDynTree::Position>_>._M_impl
                 .super__Vector_impl_data._M_start,
        uVar12 < (ulong)(((long)pPVar9[uVar20].m_vertices.
                                super__Vector_base<iDynTree::Position,_std::allocator<iDynTree::Position>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar5) / 0x18);
        uVar12 = uVar12 + 1) {
      newProjectedPoint = project(this,pPVar5 + lVar13);
      std::vector<iDynTree::VectorFixSize<2U>,_std::allocator<iDynTree::VectorFixSize<2U>_>_>::
      push_back(&projectedPoints,&newProjectedPoint);
      lVar13 = lVar13 + 0x18;
      pPVar9 = supportPolygonsExpressedInAbsoluteFrame.
               super__Vector_base<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_>._M_impl.
               super__Vector_impl_data._M_start;
    }
  }
  lVar13 = (long)projectedPoints.
                 super__Vector_base<iDynTree::VectorFixSize<2U>,_std::allocator<iDynTree::VectorFixSize<2U>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)projectedPoints.
                 super__Vector_base<iDynTree::VectorFixSize<2U>,_std::allocator<iDynTree::VectorFixSize<2U>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  uVar20 = lVar13 >> 4;
  if (2 < uVar20) {
    if (projectedPoints.
        super__Vector_base<iDynTree::VectorFixSize<2U>,_std::allocator<iDynTree::VectorFixSize<2U>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        projectedPoints.
        super__Vector_base<iDynTree::VectorFixSize<2U>,_std::allocator<iDynTree::VectorFixSize<2U>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      lVar19 = 0x3f;
      if (uVar20 != 0) {
        for (; uVar20 >> lVar19 == 0; lVar19 = lVar19 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<iDynTree::VectorFixSize<2u>*,std::vector<iDynTree::VectorFixSize<2u>,std::allocator<iDynTree::VectorFixSize<2u>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<iDynTree::ConvexHullProjectionConstraint::buildConvexHull(iDynTree::Direction,iDynTree::Direction,iDynTree::Position,std::vector<iDynTree::Polygon,std::allocator<iDynTree::Polygon>>const&,std::vector<iDynTree::Transform,std::allocator<iDynTree::Transform>>const&)::__0>>
                (projectedPoints.
                 super__Vector_base<iDynTree::VectorFixSize<2U>,_std::allocator<iDynTree::VectorFixSize<2U>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 projectedPoints.
                 super__Vector_base<iDynTree::VectorFixSize<2U>,_std::allocator<iDynTree::VectorFixSize<2U>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar19 ^ 0x3f) * 2 ^ 0x7e);
      if (lVar13 < 0x101) {
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<iDynTree::VectorFixSize<2u>*,std::vector<iDynTree::VectorFixSize<2u>,std::allocator<iDynTree::VectorFixSize<2u>>>>,__gnu_cxx::__ops::_Iter_comp_iter<iDynTree::ConvexHullProjectionConstraint::buildConvexHull(iDynTree::Direction,iDynTree::Direction,iDynTree::Position,std::vector<iDynTree::Polygon,std::allocator<iDynTree::Polygon>>const&,std::vector<iDynTree::Transform,std::allocator<iDynTree::Transform>>const&)::__0>>
                  (pVVar6,pVVar11);
      }
      else {
        pVVar18 = pVVar6 + 0x10;
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<iDynTree::VectorFixSize<2u>*,std::vector<iDynTree::VectorFixSize<2u>,std::allocator<iDynTree::VectorFixSize<2u>>>>,__gnu_cxx::__ops::_Iter_comp_iter<iDynTree::ConvexHullProjectionConstraint::buildConvexHull(iDynTree::Direction,iDynTree::Direction,iDynTree::Position,std::vector<iDynTree::Polygon,std::allocator<iDynTree::Polygon>>const&,std::vector<iDynTree::Transform,std::allocator<iDynTree::Transform>>const&)::__0>>
                  (pVVar6,pVVar18);
        for (; pVVar18 != pVVar11; pVVar18 = pVVar18 + 1) {
          std::
          __unguarded_linear_insert<__gnu_cxx::__normal_iterator<iDynTree::VectorFixSize<2u>*,std::vector<iDynTree::VectorFixSize<2u>,std::allocator<iDynTree::VectorFixSize<2u>>>>,__gnu_cxx::__ops::_Val_comp_iter<iDynTree::ConvexHullProjectionConstraint::buildConvexHull(iDynTree::Direction,iDynTree::Direction,iDynTree::Position,std::vector<iDynTree::Polygon,std::allocator<iDynTree::Polygon>>const&,std::vector<iDynTree::Transform,std::allocator<iDynTree::Transform>>const&)::__0>>
                    (pVVar18);
        }
      }
    }
    this_00 = &this->projectedConvexHull;
    std::vector<iDynTree::VectorFixSize<2U>,_std::allocator<iDynTree::VectorFixSize<2U>_>_>::resize
              (&this_00->m_vertices,
               (long)projectedPoints.
                     super__Vector_base<iDynTree::VectorFixSize<2U>,_std::allocator<iDynTree::VectorFixSize<2U>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)projectedPoints.
                     super__Vector_base<iDynTree::VectorFixSize<2U>,_std::allocator<iDynTree::VectorFixSize<2U>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3);
    uVar16 = 0;
    for (uVar12 = 0;
        uVar10 = (long)projectedPoints.
                       super__Vector_base<iDynTree::VectorFixSize<2U>,_std::allocator<iDynTree::VectorFixSize<2U>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)projectedPoints.
                       super__Vector_base<iDynTree::VectorFixSize<2U>,_std::allocator<iDynTree::VectorFixSize<2U>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 4, uVar12 < uVar10;
        uVar12 = uVar12 + 1) {
      pVVar6 = (this_00->m_vertices).
               super__Vector_base<iDynTree::VectorFixSize<2U>,_std::allocator<iDynTree::VectorFixSize<2U>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pVVar11 = projectedPoints.
                super__Vector_base<iDynTree::VectorFixSize<2U>,_std::allocator<iDynTree::VectorFixSize<2U>_>_>
                ._M_impl.super__Vector_impl_data._M_start + uVar12;
      pdVar17 = pVVar6[uVar16 - 1].m_data + 1;
      uVar10 = uVar16;
      do {
        uVar14 = uVar10;
        uVar15 = (ulong)(uVar16 != 0);
        if (uVar14 < 2) break;
        pdVar1 = pdVar17 + -3;
        pdVar2 = pdVar17 + -2;
        pVVar3 = (VectorFixSize<2U> *)(pdVar17 + -1);
        dVar4 = *pdVar17;
        pdVar17 = pdVar17 + -2;
        uVar10 = uVar14 - 1;
        uVar15 = uVar14;
      } while ((pVVar11->m_data[1] - *pdVar2) * (pVVar3->m_data[0] - *pdVar1) -
               (pVVar11->m_data[0] - *pdVar1) * (dVar4 - *pdVar2) <= 0.0);
      dVar4 = pVVar11->m_data[1];
      pVVar6 = pVVar6 + uVar15;
      pVVar6->m_data[0] = pVVar11->m_data[0];
      pVVar6->m_data[1] = dVar4;
      uVar16 = uVar15 + 1;
    }
    iVar7 = (int)uVar16;
    for (uVar8 = (int)uVar10 - 2; -1 < (int)uVar8; uVar8 = uVar8 - 1) {
      pVVar11 = projectedPoints.
                super__Vector_base<iDynTree::VectorFixSize<2U>,_std::allocator<iDynTree::VectorFixSize<2U>_>_>
                ._M_impl.super__Vector_impl_data._M_start + uVar8;
      uVar12 = uVar16 + 1;
      pVVar6 = (this_00->m_vertices).
               super__Vector_base<iDynTree::VectorFixSize<2U>,_std::allocator<iDynTree::VectorFixSize<2U>_>_>
               ._M_impl.super__Vector_impl_data._M_start + uVar16;
      do {
        pVVar18 = pVVar6;
        uVar16 = uVar12;
        if (uVar16 - 1 < (ulong)(long)(iVar7 + 1)) break;
        uVar12 = uVar16 - 1;
        pVVar6 = pVVar18 + -1;
      } while ((pVVar11->m_data[1] - pVVar18[-2].m_data[1]) *
               (pVVar18[-1].m_data[0] - pVVar18[-2].m_data[0]) -
               (pVVar11->m_data[0] - pVVar18[-2].m_data[0]) *
               (pVVar18[-1].m_data[1] - pVVar18[-2].m_data[1]) <= 0.0);
      dVar4 = pVVar11->m_data[1];
      pVVar18->m_data[0] = pVVar11->m_data[0];
      pVVar18->m_data[1] = dVar4;
    }
    std::vector<iDynTree::VectorFixSize<2U>,_std::allocator<iDynTree::VectorFixSize<2U>_>_>::resize
              (&this_00->m_vertices,uVar16 - 1);
    buildConstraintMatrix(this);
    uVar12 = iDynTree::MatrixDynSize::rows();
    iDynTree::MatrixDynSize::resize((ulong)&this->AtimesP,uVar12);
    toEigen(&local_70,&this->A);
    newProjectedPoint.m_data[1] =
         (double)local_70.
                 super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                 .
                 super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                 .m_rows.m_value;
    newProjectedPoint.m_data[0] =
         (double)local_70.
                 super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                 .
                 super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                 .m_data;
    toEigen(&local_50,&this->AtimesP);
    Eigen::internal::
    call_assignment<Eigen::Map<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::Stride<0,0>>,Eigen::Product<Eigen::Map<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::Stride<0,0>>,Eigen::Map<Eigen::Matrix<double,2,3,1,2,3>,0,Eigen::Stride<0,0>>,0>>
              (&local_50,
               (Product<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Map<Eigen::Matrix<double,_2,_3,_1,_2,_3>,_0,_Eigen::Stride<0,_0>_>,_0>
                *)&newProjectedPoint);
  }
  std::_Vector_base<iDynTree::VectorFixSize<2U>,_std::allocator<iDynTree::VectorFixSize<2U>_>_>::
  ~_Vector_base(&projectedPoints.
                 super__Vector_base<iDynTree::VectorFixSize<2U>,_std::allocator<iDynTree::VectorFixSize<2U>_>_>
               );
  std::vector<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_>::~vector
            (&supportPolygonsExpressedInAbsoluteFrame);
  return 2 < uVar20;
}

Assistant:

bool ConvexHullProjectionConstraint::buildConvexHull(const iDynTree::Direction xAxisOfPlaneInWorld,
                                                         const iDynTree::Direction yAxisOfPlaneInWorld,
                                                         const iDynTree::Position originOfPlaneInWorld,
                                                         const std::vector<Polygon> &supportPolygonsExpressedInSupportFrame,
                                                         const std::vector<Transform> &absoluteFrame_X_supportFrame)
    {
        o = originOfPlaneInWorld;
        toEigen(P).block<1, 3>(0,0) = toEigen(xAxisOfPlaneInWorld);
        toEigen(P).block<1, 3>(1,0) = toEigen(yAxisOfPlaneInWorld);

        // Transform the polygons in the absolute frame
        std::vector<Polygon> supportPolygonsExpressedInAbsoluteFrame;

        supportPolygonsExpressedInAbsoluteFrame.resize(supportPolygonsExpressedInSupportFrame.size());

        for(size_t i=0; i< supportPolygonsExpressedInSupportFrame.size(); i++)
        {
            supportPolygonsExpressedInAbsoluteFrame[i] = supportPolygonsExpressedInSupportFrame[i].applyTransform(absoluteFrame_X_supportFrame[i]);
        }

        // Project the polygons on the projection plane
        std::vector<Vector2> projectedPoints;

        for(size_t poly=0; poly < supportPolygonsExpressedInAbsoluteFrame.size(); poly++)
        {
            for(size_t vertex=0; vertex < supportPolygonsExpressedInAbsoluteFrame[poly].getNrOfVertices(); vertex++)
            {
                 Vector2 newProjectedPoint = project(supportPolygonsExpressedInAbsoluteFrame[poly](vertex));
                 //toEigen(newProjectedPoint) = toEigen(P)*toEigen(supportPolygonsExpressedInAbsoluteFrame[poly](vertex)-o);
                 projectedPoints.push_back(newProjectedPoint);
            }
        }

        if (projectedPoints.size() <= 2)
        {
            return false;
        }

        // Compute the convex hull using the Monotone Chain

        // Order the projected points with a lexographical ordering
        struct
        {
            bool operator()(Vector2 a, Vector2 b)
            {
                return (a(0) < b(0)) || ( (a(0) == b(0)) && (a(1) < b(1)) );
            }
        } vector2lexographical;

        std::sort(projectedPoints.begin(), projectedPoints.end(), vector2lexographical);

        // Reset the convex hull (it will be properly resized after running the algorithm
        projectedConvexHull.m_vertices.resize(2*projectedPoints.size());
        size_t k = 0;

        // Build the upper hull
        for (int i = 0; i < projectedPoints.size(); ++i)
        {
            while (k >= 2 && monotono_chain_cross(projectedConvexHull.m_vertices[k-2],
                                                  projectedConvexHull.m_vertices[k-1],
                                                  projectedPoints[i]) <= 0)
            {
                k = k-1;
            }

            projectedConvexHull.m_vertices[k] = projectedPoints[i];
            k = k+1;

        }

        // Build the lower hull
        for (int i = projectedPoints.size()-2, t = k+1; i >= 0; i--)
        {
            while (k >= t && monotono_chain_cross(projectedConvexHull.m_vertices[k-2],
                                                  projectedConvexHull.m_vertices[k-1],
                                                  projectedPoints[i]) <= 0)
            {
                k = k-1;
            }

            projectedConvexHull.m_vertices[k] = projectedPoints[i];
            k = k+1;
        }

        projectedConvexHull.m_vertices.resize(k-1);

        // Build the constraint matrix
        buildConstraintMatrix();

        // Update AtimesP matrix
        AtimesP.resize(A.rows(),P.cols());

        toEigen(AtimesP) = toEigen(A)*toEigen(P);

        return true;
    }